

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O0

file_index_t __thiscall
libtorrent::file_storage::file_index_at_offset(file_storage *this,int64_t offset)

{
  unsigned_long uVar1;
  difference_type dVar2;
  __normal_iterator<const_libtorrent::aux::file_entry_*,_std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>_>
  local_78;
  file_entry *local_70;
  __normal_iterator<const_libtorrent::aux::file_entry_*,_std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>_>
  local_68;
  __normal_iterator<const_libtorrent::aux::file_entry_*,_std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>_>
  local_60;
  __normal_iterator<const_libtorrent::aux::file_entry_*,_std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>_>
  file_iter;
  undefined1 local_48 [8];
  file_entry target;
  int64_t offset_local;
  file_storage *this_local;
  
  target._32_8_ = offset;
  libtorrent::aux::file_entry::file_entry((file_entry *)local_48);
  uVar1 = libtorrent::aux::numeric_cast<unsigned_long,long,void>(target._32_8_);
  local_48 = (undefined1  [8])((ulong)local_48 & 0xffff000000000000 | uVar1 & 0xffffffffffff);
  local_68._M_current =
       (file_entry *)
       ::std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>::
       begin(&(this->m_files).
              super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
            );
  local_70 = (file_entry *)
             ::std::
             vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>::end
                       (&(this->m_files).
                         super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                       );
  local_60 = ::std::
             upper_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::file_entry_const*,std::vector<libtorrent::aux::file_entry,std::allocator<libtorrent::aux::file_entry>>>,libtorrent::aux::file_entry,bool(*)(libtorrent::aux::file_entry_const&,libtorrent::aux::file_entry_const&)>
                       (local_68,(__normal_iterator<const_libtorrent::aux::file_entry_*,_std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>_>
                                  )local_70,(file_entry *)local_48,
                        anon_unknown_24::compare_file_offset);
  __gnu_cxx::
  __normal_iterator<const_libtorrent::aux::file_entry_*,_std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>_>
  ::operator--(&local_60);
  local_78._M_current =
       (file_entry *)
       ::std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>::
       begin(&(this->m_files).
              super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
            );
  dVar2 = __gnu_cxx::operator-(&local_60,&local_78);
  libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef
            ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)((long)&this_local + 4),
             (int)dVar2);
  libtorrent::aux::file_entry::~file_entry((file_entry *)local_48);
  return (file_index_t)this_local._4_4_;
}

Assistant:

file_index_t file_storage::file_index_at_offset(std::int64_t const offset) const
	{
		TORRENT_ASSERT_PRECOND(offset >= 0);
		TORRENT_ASSERT_PRECOND(offset < m_total_size);
		TORRENT_ASSERT(offset <= max_file_offset);
		// find the file iterator and file offset
		aux::file_entry target;
		target.offset = aux::numeric_cast<std::uint64_t>(offset);
		TORRENT_ASSERT(!compare_file_offset(target, m_files.front()));

		auto file_iter = std::upper_bound(
			m_files.begin(), m_files.end(), target, compare_file_offset);

		TORRENT_ASSERT(file_iter != m_files.begin());
		--file_iter;
		return file_index_t{int(file_iter - m_files.begin())};
	}